

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blendshape_fitting.hpp
# Opt level: O1

vector<float,_std::allocator<float>_> *
eos::fitting::fit_blendshapes_to_landmarks_nnls
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
          *blendshapes,VectorXf *face_instance,Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *landmarks,vector<int,_std::allocator<int>_> *vertex_ids)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  vector<float,std::allocator<float>> *pvVar6;
  Index size;
  undefined8 *puVar7;
  ulong uVar8;
  char *pcVar9;
  float *pfVar10;
  undefined8 uVar11;
  PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *pPVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  VectorXf coefficients;
  vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> P_coefficients;
  MatrixXf A;
  MatrixXf b;
  MatrixXf V_hat_h;
  VectorXf v_bar;
  VectorXf y;
  MatrixXf blendshapes_as_basis;
  NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> nnls;
  SparseMatrix<float,_0,_int> P;
  DenseStorage<float,__1,__1,_1,_0> local_278;
  undefined1 local_268 [8];
  LhsNested pSStack_260;
  Triplet<float,_int> *local_258;
  long local_250;
  DenseStorage<float,__1,__1,__1,_0> local_248;
  ulong local_230;
  DenseStorage<float,__1,__1,__1,_0> local_228;
  Matrix<float,__1,__1,_0,__1,__1> local_208;
  LhsNested local_1f0;
  vector<int,_std::allocator<int>_> *local_1e8;
  void *local_1e0;
  SrcEvaluatorType *local_1d8;
  void *local_1d0;
  DenseStorage<float,__1,__1,__1,_0> *local_1c8;
  ColVectorType local_1c0;
  VectorXf *local_1b0;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *local_1a8;
  vector<float,std::allocator<float>> *local_1a0;
  LhsNested local_198;
  ulong local_190;
  float *local_188;
  ulong local_180;
  long local_178;
  MatrixXf local_170;
  undefined1 local_158 [8];
  variable_if_dynamic<long,__1> local_150;
  variable_if_dynamic<long,__1> local_148;
  Matrix<float,__1,__1,_0,__1,__1> *local_140;
  variable_if_dynamic<long,__1> local_138;
  variable_if_dynamic<long,__1> local_130;
  SrcEvaluatorType *local_128;
  float *local_110;
  ulong local_108;
  float *local_100;
  float *local_f0;
  float *local_e0;
  long *local_d0;
  float *local_c0;
  float *local_a8;
  float *local_98;
  SparseMatrix<float,_0,_int> local_88;
  DenseStorage<float,__1,__1,__1,_0> *local_40 [2];
  
  lVar16 = (long)(landmarks->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(landmarks->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  local_1e8 = vertex_ids;
  local_1a8 = landmarks;
  local_188 = (float *)affine_camera_matrix;
  if (lVar16 != (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) {
    __assert_fail("landmarks.size() == vertex_ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/blendshape_fitting.hpp"
                  ,0x8f,
                  "std::vector<float> eos::fitting::fit_blendshapes_to_landmarks_nnls(const std::vector<morphablemodel::Blendshape> &, const Eigen::VectorXf &, Eigen::Matrix<float, 3, 4>, const std::vector<Eigen::Vector2f> &, const std::vector<int> &)"
                 );
  }
  pPVar12 = (PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
            (((long)(blendshapes->
                    super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(blendshapes->
                    super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  morphablemodel::to_matrix(&local_170,blendshapes);
  uVar14 = (uint)lVar16;
  local_1f0 = (LhsNested)(long)(int)(uVar14 * 4);
  local_148.m_value = (ulong)local_148.m_value._4_4_ << 0x20;
  local_158 = (undefined1  [8])local_1f0;
  local_150.m_value = (long)pPVar12;
  if ((long)((ulong)pPVar12 | (ulong)local_1f0) < 0) {
    pcVar9 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
    ;
  }
  else {
    local_1b0 = face_instance;
    local_1a0 = (vector<float,std::allocator<float>> *)__return_storage_ptr__;
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_208,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)local_158);
    local_250 = lVar16;
    if (0 < (int)uVar14) {
      lVar17 = 0;
      lVar16 = 0;
      do {
        if (local_170.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0 &&
            local_170.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_data != (float *)0x0) {
          pcVar9 = 
          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>>, Level = 0]"
          ;
LAB_00162030:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb2,pcVar9);
        }
        iVar3 = *(int *)((long)(local_1e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar16);
        if (((iVar3 < 0) ||
            (local_170.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols < 0)) ||
           ((long)((long)&((Triplet<float,_int> *)
                          (local_170.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                           .m_storage.m_rows + -0xc))->m_value + 1) < (long)iVar3 * 3)) {
          pcVar9 = 
          "Eigen::Block<const Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
          ;
LAB_00161ff2:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                        ,0x93,pcVar9);
        }
        local_158 = (undefined1  [8])
                    ((long)local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                           .m_storage.m_data + lVar17);
        local_150.m_value = 3;
        local_148.m_value =
             local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
        if (local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0 &&
            local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_data != (float *)0x0) {
          pcVar9 = 
          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>>, Level = 0]"
          ;
          goto LAB_00162030;
        }
        local_140 = &local_208;
        local_130.m_value = 0;
        local_128 = (SrcEvaluatorType *)
                    local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
        local_138.m_value = lVar16;
        if ((local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols < 0) ||
           (local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows + 0xffffffffffffffe8U + 0x15U < lVar16)) {
          pcVar9 = 
          "Eigen::Block<Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
          ;
          goto LAB_00161ff2;
        }
        local_268 = (undefined1  [8])
                    (local_170.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data + (long)iVar3 * 3);
        local_258 = (Triplet<float,_int> *)
                    local_170.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
        if (local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != local_170.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseBase.h"
                        ,0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>>]"
                       );
        }
        local_248.m_cols =
             local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_88._0_8_ = &local_248;
        local_88.m_outerIndex = (StorageIndex *)local_158;
        local_248.m_data = (float *)local_158;
        local_88.m_outerSize = (Index)local_268;
        local_88.m_innerSize = (Index)&local_228;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)&local_88);
        lVar16 = lVar16 + 4;
        lVar17 = lVar17 + 0x10;
      } while ((ulong)(uVar14 & 0x7fffffff) << 2 != lVar16);
    }
    lVar16 = local_250;
    local_198 = (LhsNested)((local_250 << 0x20) * 3 >> 0x20);
    local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
    local_88.m_outerSize = 0;
    local_88.m_innerSize = 0;
    local_88.m_outerIndex = (StorageIndex *)0x0;
    local_88.m_innerNonZeros = (StorageIndex *)0x0;
    local_88.m_data.m_values = (Scalar *)0x0;
    local_88.m_data.m_indices = (StorageIndex *)0x0;
    local_88.m_data.m_size = 0;
    local_88.m_data.m_allocatedSize = 0;
    Eigen::SparseMatrix<float,_0,_int>::resize(&local_88,(Index)local_198,(Index)local_1f0);
    local_268 = (undefined1  [8])0x0;
    pSStack_260 = (LhsNested)0x0;
    local_258 = (Triplet<float,_int> *)0x0;
    if (0 < (int)lVar16) {
      local_190 = (ulong)((uint)local_250 & 0x7fffffff);
      local_230 = 0;
      uVar8 = 0;
      do {
        local_178 = uVar8 * 3;
        bVar18 = true;
        uVar15 = 0;
        pfVar10 = local_188;
        local_180 = uVar8;
        do {
          iVar3 = (int)local_178;
          lVar16 = -0x30;
          uVar8 = local_230 & 0xffffffff;
          do {
            if (!bVar18) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, 3, 4>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<float, 3, 4>, Level = 1]"
                           );
            }
            local_158._4_4_ = (int)uVar8;
            local_158._0_4_ = (int)uVar15 + iVar3;
            fVar2 = *(float *)((long)pfVar10 + lVar16 + 0x30);
            local_150.m_value._0_4_ = fVar2;
            if (pSStack_260 == (LhsNested)local_258) {
              std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>::
              _M_realloc_insert<Eigen::Triplet<float,int>>
                        ((vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>
                          *)local_268,(iterator)pSStack_260,(Triplet<float,_int> *)local_158);
            }
            else {
              *(float *)&pSStack_260->m_outerSize = fVar2;
              pSStack_260->super_SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_> =
                   local_158;
              pSStack_260 = (LhsNested)((long)pSStack_260 + 0xc);
            }
            uVar8 = (ulong)((int)uVar8 + 1);
            lVar16 = lVar16 + 0xc;
          } while (lVar16 != 0);
          bVar18 = uVar15 < 2;
          uVar15 = uVar15 + 1;
          pfVar10 = pfVar10 + 1;
        } while (uVar15 != 3);
        uVar8 = local_180 + 1;
        local_230 = (ulong)((int)local_230 + 4);
      } while (uVar8 != local_190);
    }
    local_158 = local_268;
    local_248.m_data = (float *)pSStack_260;
    Eigen::internal::
    set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<float,int>*,std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>>,Eigen::SparseMatrix<float,0,int>,Eigen::internal::scalar_sum_op<float,float>>
              (local_158,&local_248,&local_88,&local_228);
    local_158 = (undefined1  [8])local_198;
    local_150.m_value._4_4_ = 0x3f800000;
    if (-1 < (long)local_198) {
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_1d0,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_158);
      uVar14 = (uint)local_250;
      if (0 < (int)uVar14) {
        pfVar10 = (float *)((long)&(((local_1a8->
                                     super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).
                                   m_storage.m_data + 4);
        lVar16 = 0;
        do {
          if (((long)local_1c8 <= lVar16) ||
             (*(float *)((long)local_1d0 + lVar16 * 4) =
                   ((plain_array<float,_2,_0,_0> *)(pfVar10 + -1))->array[0],
             (long)local_1c8 <= lVar16 + 1)) goto LAB_00161f71;
          *(float *)((long)local_1d0 + lVar16 * 4 + 4) = *pfVar10;
          lVar16 = lVar16 + 3;
          pfVar10 = pfVar10 + 2;
        } while ((ulong)(uVar14 & 0x7fffffff) * 3 != lVar16);
      }
      local_158 = (undefined1  [8])local_1f0;
      local_150.m_value._4_4_ = 0x3f800000;
      if (-1 < (int)uVar14) {
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_1e0,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                    *)local_158);
        if (uVar14 != 0) {
          piVar4 = (local_1e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar10 = (local_1b0->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          lVar16 = (local_1b0->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows;
          lVar17 = 0;
          do {
            lVar13 = (long)*(int *)((long)piVar4 + lVar17);
            if ((lVar13 < 0) || (lVar16 <= lVar13 * 3)) {
LAB_00161f90:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0xb5,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<float, -1, 1>, Level = 0]"
                           );
            }
            if ((long)local_1d8 <= lVar17) {
LAB_00161f71:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<float, -1, 1>, Level = 1]"
                           );
            }
            *(float *)((long)local_1e0 + lVar17 * 4) = pfVar10[lVar13 * 3];
            iVar3 = (int)(lVar13 * 3);
            uVar8 = (ulong)(iVar3 + 1);
            if (lVar16 <= (long)uVar8) goto LAB_00161f90;
            if ((long)local_1d8 <= lVar17 + 1) goto LAB_00161f71;
            *(float *)((long)local_1e0 + lVar17 * 4 + 4) = pfVar10[uVar8];
            uVar8 = (ulong)(iVar3 + 2);
            if (lVar16 <= (long)uVar8) goto LAB_00161f90;
            if ((long)local_1d8 <= lVar17 + 2) goto LAB_00161f71;
            *(float *)((long)local_1e0 + lVar17 * 4 + 8) = pfVar10[uVar8];
            lVar17 = lVar17 + 4;
          } while ((ulong)(uVar14 & 0x7fffffff) << 2 != lVar17);
        }
        if (local_88.m_outerSize !=
            local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows) {
          pcVar9 = 
          "Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<float>, _Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
          ;
LAB_00162108:
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                        ,0x62,pcVar9);
        }
        local_150.m_value = (long)&local_208;
        local_248.m_data = (float *)0x0;
        local_248.m_rows = 0;
        local_248.m_cols = 0;
        bVar18 = (DenseStorage<float,__1,__1,__1,_0> *)local_88.m_innerSize ==
                 (DenseStorage<float,__1,__1,__1,_0> *)0x0;
        bVar19 = (PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
                 local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage
                 .m_cols == (PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)0x0;
        local_158 = (undefined1  [8])&local_88;
        if ((!bVar19 && !bVar18) &&
           (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
           uVar11 = SUB168(auVar5 % SEXT816(local_208.
                                            super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                            .m_storage.m_cols),0),
           SUB168(auVar5 / SEXT816(local_208.
                                   super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_cols),0) < local_88.m_innerSize)) {
LAB_001620c5:
          puVar7 = (undefined8 *)__cxa_allocate_exception(8,bVar19 || bVar18,uVar11);
          *puVar7 = boost::program_options::detail::cmdline::cmdline;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        if (-1 < (local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols | local_88.m_innerSize)) {
          if ((!bVar19 && !bVar18) &&
             (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
             uVar11 = SUB168(auVar5 % SEXT816(local_208.
                                              super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                              .m_storage.m_cols),0),
             SUB168(auVar5 / SEXT816(local_208.
                                     super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_cols),0) < local_88.m_innerSize))
          goto LAB_001620c5;
          Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize
                    (&local_248,
                     local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols * local_88.m_innerSize,local_88.m_innerSize,
                     local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols);
          Eigen::internal::
          Assignment<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<float,__1,__1,_0,__1,__1> *)&local_248,(SrcXprType *)local_158,
                (assign_op<float,_float> *)&local_228);
          if ((SrcEvaluatorType *)local_88.m_outerSize != local_1d8) {
            pcVar9 = 
            "Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<float>, _Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
            ;
            goto LAB_00162108;
          }
          local_150.m_value = (long)&local_1e0;
          local_148.m_value = (long)&local_1d0;
          if ((DenseStorage<float,__1,__1,__1,_0> *)local_88.m_innerSize != local_1c8) {
            local_158 = (undefined1  [8])&local_88;
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                          ,0x74,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>, const Eigen::Matrix<float, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Matrix<float, -1, 1>]"
                         );
          }
          local_228.m_data = (float *)0x0;
          local_228.m_rows = 0;
          local_228.m_cols = 0;
          if (-1 < (long)local_1c8) {
            local_158 = (undefined1  [8])&local_88;
            Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize
                      (&local_228,(Index)local_1c8,(Index)local_1c8,1);
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const,Eigen::Matrix<float,_1,1,0,_1,1>const>,Eigen::internal::assign_op<float,float>>
                      ((Matrix<float,__1,__1,_0,__1,__1> *)&local_228,
                       (CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                        *)local_158,(assign_op<float,_float> *)&local_278);
            local_278.m_data = (float *)0x0;
            local_278.m_rows = 0;
            Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::NNLS
                      ((NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_158,
                       (MatrixType *)&local_248,100,1e-10);
            local_40[0] = &local_228;
            Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>>
                      ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_1c0,
                       (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                        *)local_40);
            Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::solve
                      ((NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_158,&local_1c0,
                       MAX_DESCENT);
            free(local_1c0.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
            pfVar10 = local_110;
            if (local_278.m_rows == local_108) {
LAB_00161dbc:
              pvVar6 = local_1a0;
              if (local_278.m_rows == local_108) {
                uVar8 = local_278.m_rows + 3;
                if (-1 < local_278.m_rows) {
                  uVar8 = local_278.m_rows;
                }
                uVar8 = uVar8 & 0xfffffffffffffffc;
                if (3 < local_278.m_rows) {
                  lVar16 = 0;
                  do {
                    pfVar1 = pfVar10 + lVar16;
                    uVar11 = *(undefined8 *)(pfVar1 + 2);
                    *(undefined8 *)(local_278.m_data + lVar16) = *(undefined8 *)pfVar1;
                    *(undefined8 *)(local_278.m_data + lVar16 + 2) = uVar11;
                    lVar16 = lVar16 + 4;
                  } while (lVar16 < (long)uVar8);
                }
                if ((long)uVar8 < local_278.m_rows) {
                  do {
                    local_278.m_data[uVar8] = pfVar10[uVar8];
                    uVar8 = uVar8 + 1;
                  } while (local_278.m_rows != uVar8);
                }
                std::vector<float,std::allocator<float>>::vector<float*,void>
                          (local_1a0,local_278.m_data,local_278.m_data + local_278.m_rows,
                           (allocator_type *)&local_1c0);
                free(local_98);
                free(local_a8);
                free(local_c0);
                free(local_d0);
                free(local_e0);
                free(local_f0);
                free(local_100);
                free(local_110);
                free(local_128);
                free(local_140);
                free(local_278.m_data);
                free(local_228.m_data);
                free(local_248.m_data);
                free(local_1e0);
                free(local_1d0);
                if (local_268 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_268,(long)local_258 - (long)local_268);
                }
                free(local_88.m_outerIndex);
                free(local_88.m_innerNonZeros);
                Eigen::internal::CompressedStorage<float,_int>::~CompressedStorage(&local_88.m_data)
                ;
                free(local_208.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_170.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                return (vector<float,_std::allocator<float>_> *)pvVar6;
              }
              __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                            ,0x2fd,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::Matrix<float, -1, 1>, T1 = float, T2 = float]"
                           );
            }
            if (-1 < (long)local_108) {
              Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize(&local_278,local_108,local_108,1);
              goto LAB_00161dbc;
            }
            pcVar9 = 
            "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
            ;
            goto LAB_00162066;
          }
        }
        pcVar9 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
        ;
        local_158 = (undefined1  [8])&local_88;
LAB_00162066:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x115,pcVar9);
      }
    }
    pcVar9 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 1>]"
    ;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,pcVar9);
}

Assistant:

inline std::vector<float> fit_blendshapes_to_landmarks_nnls(
    const std::vector<morphablemodel::Blendshape>& blendshapes, const Eigen::VectorXf& face_instance,
    Eigen::Matrix<float, 3, 4> affine_camera_matrix, const std::vector<Eigen::Vector2f>& landmarks,
    const std::vector<int>& vertex_ids)
{
    assert(landmarks.size() == vertex_ids.size());

    using Eigen::MatrixXf;
    using Eigen::VectorXf;

    const auto num_blendshapes = blendshapes.size();
    const int num_landmarks = static_cast<int>(landmarks.size());

    // Copy all blendshapes into a "basis" matrix with each blendshape being a column:
    const MatrixXf blendshapes_as_basis = morphablemodel::to_matrix(blendshapes);

    // $\hat{V} \in R^{3N\times m-1}$, subselect the rows of the eigenvector matrix $V$ associated with the $N$ feature points
    // And we insert a row of zeros after every third row, resulting in matrix $\hat{V}_h \in R^{4N\times m-1}$:
    MatrixXf V_hat_h = MatrixXf::Zero(4 * num_landmarks, num_blendshapes);
    int row_index = 0;
    for (int i = 0; i < num_landmarks; ++i)
    {
        V_hat_h.block(row_index, 0, 3, V_hat_h.cols()) =
            blendshapes_as_basis.block(vertex_ids[i] * 3, 0, 3, blendshapes_as_basis.cols());
        row_index += 4; // replace 3 rows and skip the 4th one, it has all zeros
    }

    // Form a block diagonal matrix $P \in R^{3N\times 4N}$ in which the camera matrix C (P_Affine, affine_camera_matrix) is placed on the diagonal:
    Eigen::SparseMatrix<float> P(3 * num_landmarks, 4 * num_landmarks);
    std::vector<Eigen::Triplet<float>> P_coefficients; // list of non-zeros coefficients
    for (int i = 0; i < num_landmarks; ++i)
    { // Note: could make this the inner-most loop.
        for (int x = 0; x < affine_camera_matrix.rows(); ++x)
        {
            for (int y = 0; y < affine_camera_matrix.cols(); ++y)
            {
                P_coefficients.push_back(
                    Eigen::Triplet<float>(3 * i + x, 4 * i + y, affine_camera_matrix(x, y)));
            }
        }
    }
    P.setFromTriplets(P_coefficients.begin(), P_coefficients.end());

    // The landmarks in matrix notation (in homogeneous coordinates), $3N\times 1$
    VectorXf y = VectorXf::Ones(3 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        y(3 * i) = landmarks[i][0];
        y((3 * i) + 1) = landmarks[i][1];
        // y_((3 * i) + 2) = 1; // already 1, stays (homogeneous coordinate)
    }

    // The mean, with an added homogeneous coordinate (x_1, y_1, z_1, 1, x_2, ...)^t
    VectorXf v_bar = VectorXf::Ones(4 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        v_bar(4 * i) = face_instance(vertex_ids[i] * 3);
        v_bar((4 * i) + 1) = face_instance(vertex_ids[i] * 3 + 1);
        v_bar((4 * i) + 2) = face_instance(vertex_ids[i] * 3 + 2);
        // v_bar((4 * i) + 3) = 1; // already 1, stays (homogeneous coordinate)
    }

    // Bring into standard least squares form:
    const MatrixXf A = P * V_hat_h;   // camera matrix times the basis
    const MatrixXf b = P * v_bar - y; // camera matrix times the mean, minus the landmarks

    // Solve using NNLS:
    VectorXf coefficients;
    Eigen::NNLS<MatrixXf> nnls(A, 100); // In the multi-image fitting, the solver sometimes got stuck. This limits it to 100 iterations. It normaly converges within <10 iterations. This should be fine for the single-image fitting as well.
    bool non_singular = nnls.solve(-b);
    coefficients.noalias() = nnls.x();

    return std::vector<float>(coefficients.data(), coefficients.data() + coefficients.size());
}